

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&,char_const*>
          (String *__return_storage_ptr__,kj *this,Builder *params,char **params_1)

{
  StringTree SStack_58;
  ArrayPtr<const_char> local_20;
  
  capnproto_test::capnp::test::TestAllTypes::Builder::toString(&SStack_58,(Builder *)this);
  local_20 = toCharSequence<char_const*>((char **)params);
  _::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&SStack_58,(StringTree *)&local_20,&local_20);
  StringTree::~StringTree(&SStack_58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}